

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

void __thiscall
SolidGlassMaterial::SolidGlassMaterial
          (SolidGlassMaterial *this,float coef,Texture *reflect_color,Texture *refract_color)

{
  Texture *pTVar1;
  uchar *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  
  (this->super_Material)._vptr_Material = (_func_int **)&PTR_shade_001fa900;
  uVar4 = *(undefined4 *)&reflect_color->field_0x4;
  pTVar1 = reflect_color->source;
  (this->reflectColor).type = reflect_color->type;
  *(undefined4 *)&(this->reflectColor).field_0x4 = uVar4;
  (this->reflectColor).source = pTVar1;
  Vector3f::Vector3f(&(this->reflectColor).color,&reflect_color->color);
  std::function<Vector2f_(Vector2f)>::function(&(this->reflectColor).scale,&reflect_color->scale);
  (this->reflectColor).empty = reflect_color->empty;
  iVar5 = reflect_color->image_h;
  iVar6 = reflect_color->image_c;
  uVar4 = *(undefined4 *)&reflect_color->field_0x4c;
  puVar2 = reflect_color->image_buff_stbi;
  pfVar3 = reflect_color->hdr_buff;
  (this->reflectColor).image_w = reflect_color->image_w;
  (this->reflectColor).image_h = iVar5;
  (this->reflectColor).image_c = iVar6;
  *(undefined4 *)&(this->reflectColor).field_0x4c = uVar4;
  (this->reflectColor).image_buff_stbi = puVar2;
  (this->reflectColor).hdr_buff = pfVar3;
  uVar4 = *(undefined4 *)&refract_color->field_0x4;
  pTVar1 = refract_color->source;
  (this->refractColor).type = refract_color->type;
  *(undefined4 *)&(this->refractColor).field_0x4 = uVar4;
  (this->refractColor).source = pTVar1;
  Vector3f::Vector3f(&(this->refractColor).color,&refract_color->color);
  std::function<Vector2f_(Vector2f)>::function(&(this->refractColor).scale,&refract_color->scale);
  (this->refractColor).empty = refract_color->empty;
  iVar5 = refract_color->image_h;
  iVar6 = refract_color->image_c;
  uVar4 = *(undefined4 *)&refract_color->field_0x4c;
  puVar2 = refract_color->image_buff_stbi;
  pfVar3 = refract_color->hdr_buff;
  (this->refractColor).image_w = refract_color->image_w;
  (this->refractColor).image_h = iVar5;
  (this->refractColor).image_c = iVar6;
  *(undefined4 *)&(this->refractColor).field_0x4c = uVar4;
  (this->refractColor).image_buff_stbi = puVar2;
  (this->refractColor).hdr_buff = pfVar3;
  this->refractCoef = 1.0 / coef;
  return;
}

Assistant:

SolidGlassMaterial(float coef = 1,
		const Texture& reflect_color = Vector3f::ZERO,
		const Texture& refract_color = Vector3f::ZERO) :
		refractCoef(coef),
		reflectColor(reflect_color),refractColor(refract_color) {
		refractCoef = 1 / refractCoef;

//		r0 = (1 - refractCoef) / (1 + refractCoef); r0 *= r0;
	}